

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_simplification.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConjunctionSimplificationRule::Apply
          (ConjunctionSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  Expression *expr;
  bool bVar1;
  reference pvVar2;
  BoundConjunctionExpression *expr_00;
  ClientContext *context;
  BoundConjunctionExpression *conj;
  LogicalType local_d8;
  undefined1 local_c0 [88];
  Value constant_value;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  expr_00 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                      (&pvVar2->_M_data->super_BaseExpression);
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  expr = pvVar2->_M_data;
  LogicalType::LogicalType((LogicalType *)(local_c0 + 0x40),SQLNULL);
  Value::Value(&constant_value,(LogicalType *)(local_c0 + 0x40));
  LogicalType::~LogicalType((LogicalType *)(local_c0 + 0x40));
  context = Rule::GetContext((Rule *)op);
  bVar1 = ExpressionExecutor::TryEvaluateScalar(context,expr,&constant_value);
  if (bVar1) {
    LogicalType::LogicalType(&local_d8,BOOLEAN);
    Value::DefaultCastAs((Value *)local_c0,&constant_value,&local_d8,false);
    conj = (BoundConjunctionExpression *)local_c0;
    Value::operator=(&constant_value,(Value *)local_c0);
    Value::~Value((Value *)local_c0);
    LogicalType::~LogicalType(&local_d8);
    if (constant_value.is_null != true) {
      if ((expr_00->super_Expression).super_BaseExpression.type == CONJUNCTION_AND) {
        bVar1 = BooleanValue::Get(&constant_value);
        if (bVar1) {
LAB_015ac7ec:
          RemoveExpression(this,conj,&expr_00->super_Expression);
          goto LAB_015ac75b;
        }
        Value::BOOLEAN((Value *)local_c0,false);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                  ((duckdb *)&local_d8,(Value *)local_c0);
      }
      else {
        bVar1 = BooleanValue::Get(&constant_value);
        if (!bVar1) goto LAB_015ac7ec;
        Value::BOOLEAN((Value *)local_c0,true);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                  ((duckdb *)&local_d8,(Value *)local_c0);
      }
      (this->super_Rule)._vptr_Rule = (_func_int **)local_d8._0_8_;
      local_d8._0_8_ = (_func_int **)0x0;
      Value::~Value((Value *)local_c0);
      goto LAB_015ac75b;
    }
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
LAB_015ac75b:
  Value::~Value(&constant_value);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConjunctionSimplificationRule::Apply(LogicalOperator &op,
                                                            vector<reference<Expression>> &bindings, bool &changes_made,
                                                            bool is_root) {
	auto &conjunction = bindings[0].get().Cast<BoundConjunctionExpression>();
	auto &constant_expr = bindings[1].get();
	// the constant_expr is a scalar expression that we have to fold
	// use an ExpressionExecutor to execute the expression
	D_ASSERT(constant_expr.IsFoldable());
	Value constant_value;
	if (!ExpressionExecutor::TryEvaluateScalar(GetContext(), constant_expr, constant_value)) {
		return nullptr;
	}
	constant_value = constant_value.DefaultCastAs(LogicalType::BOOLEAN);
	if (constant_value.IsNull()) {
		// we can't simplify conjunctions with a constant NULL
		return nullptr;
	}
	if (conjunction.GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		if (!BooleanValue::Get(constant_value)) {
			// FALSE in AND, result of expression is false
			return make_uniq<BoundConstantExpression>(Value::BOOLEAN(false));
		} else {
			// TRUE in AND, remove the expression from the set
			return RemoveExpression(conjunction, constant_expr);
		}
	} else {
		D_ASSERT(conjunction.GetExpressionType() == ExpressionType::CONJUNCTION_OR);
		if (!BooleanValue::Get(constant_value)) {
			// FALSE in OR, remove the expression from the set
			return RemoveExpression(conjunction, constant_expr);
		} else {
			// TRUE in OR, result of expression is true
			return make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
		}
	}
}